

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::prepareForCoarsening(Level *this,Level *rhs,int max_grid_size,IntVect ngrow)

{
  undefined8 uVar1;
  bool bVar2;
  EBCellFlagFab *this_00;
  reference pvVar3;
  FabArray<amrex::EBCellFlagFab> *in_RSI;
  Geometry *in_RDI;
  IntVect edge_type;
  int idim;
  int ng;
  Box *vbx;
  FabType t;
  MFIter mfi;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> covered_boxes;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> cut_boxes;
  FabArray<amrex::EBCellFlagFab> cflag;
  Box result;
  BoxArray all_grids;
  BoxArray *rhs_00;
  undefined8 *puVar4;
  undefined1 *__n;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff470;
  BoxList *in_stack_fffffffffffff478;
  BoxArray *in_stack_fffffffffffff480;
  BoxArray *in_stack_fffffffffffff488;
  MFInfo *in_stack_fffffffffffff490;
  FabArrayBase *in_stack_fffffffffffff498;
  MFIter *in_stack_fffffffffffff4a0;
  BoxArray *in_stack_fffffffffffff4a8;
  Real *pRVar5;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff4b0;
  undefined8 *puVar6;
  BoxArray *in_stack_fffffffffffff4b8;
  IntVect *this_01;
  Geometry *in_stack_fffffffffffff4c0;
  MultiFab *in_stack_fffffffffffff4c8;
  Level *in_stack_fffffffffffff4d0;
  Array<MultiFab_*,_3> *in_stack_fffffffffffff4d8;
  Level *in_stack_fffffffffffff4e0;
  char *in_stack_fffffffffffff688;
  int in_stack_fffffffffffff694;
  char *in_stack_fffffffffffff698;
  char *in_stack_fffffffffffff6a0;
  undefined8 local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  Geometry *in_stack_fffffffffffff6e0;
  MultiFab *in_stack_fffffffffffff6e8;
  Level *in_stack_fffffffffffff6f0;
  undefined1 local_908 [8];
  Geometry *in_stack_fffffffffffff700;
  MultiFab *in_stack_fffffffffffff708;
  Level *in_stack_fffffffffffff710;
  Geometry *in_stack_fffffffffffff768;
  Geometry *in_stack_fffffffffffff770;
  Level *in_stack_fffffffffffff778;
  Level *in_stack_fffffffffffff780;
  Geometry *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  Level *in_stack_fffffffffffff7b8;
  undefined1 local_838 [104];
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  int local_7a0 [2];
  int local_798;
  int local_790 [2];
  int local_788;
  undefined1 local_780 [108];
  int local_714;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  int local_5a8 [2];
  int local_5a0;
  int local_598 [2];
  int local_590;
  undefined1 local_3fc [28];
  undefined1 *local_3e0;
  FabType local_3d4;
  MFIter local_3d0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_370;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_358;
  BoxArray local_340 [4];
  Box local_168 [5];
  FabArray<amrex::EBCellFlagFab> *local_d0;
  IntVect local_b0;
  IntVect *local_a0;
  Box *local_98;
  char *local_90;
  undefined4 local_84;
  char *local_80;
  char *local_78;
  int local_70 [2];
  int local_68;
  IntVect local_5c;
  int local_50 [2];
  int local_48;
  int local_40;
  IntVect local_3c;
  int local_30 [2];
  int local_28;
  int local_1c;
  IntVect local_18;
  int local_c;
  IntVect *local_8;
  
  local_d0 = in_RSI;
  local_98 = Geometry::Domain(in_RDI);
  local_a0 = &local_b0;
  local_168[0].smallend.vect._0_8_ = *(undefined8 *)(local_98->smallend).vect;
  uVar1 = *(undefined8 *)((local_98->smallend).vect + 2);
  local_168[0]._20_8_ = *(undefined8 *)((local_98->bigend).vect + 2);
  local_168[0].bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_98->bigend).vect >> 0x20);
  local_168[0].smallend.vect[2] = (int)uVar1;
  local_168[0].bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
  Box::grow(local_168,local_a0);
  BoxArray::BoxArray(in_stack_fffffffffffff4b8,(Box *)in_stack_fffffffffffff4b0);
  BoxArray::maxSize(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
  ParallelDescriptor::NProcs();
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
  local_340[0].m_bat.m_op._20_8_ = 0;
  local_340[0].m_bat.m_op._28_8_ = 0;
  local_340[0].m_bat.m_op._4_8_ = 0;
  local_340[0].m_bat.m_op._12_8_ = 0;
  local_340[0].m_bat.m_op._36_8_ = 0;
  MFInfo::MFInfo((MFInfo *)0x11f8d5a);
  local_340[0].m_bat._0_8_ = 0;
  rhs_00 = local_340;
  DefaultFabFactory<amrex::EBCellFlagFab>::DefaultFabFactory
            ((DefaultFabFactory<amrex::EBCellFlagFab> *)in_stack_fffffffffffff470);
  FabArray<amrex::EBCellFlagFab>::FabArray
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
             (DistributionMapping *)in_stack_fffffffffffff4a0,
             (int)((ulong)in_stack_fffffffffffff498 >> 0x20),(int)in_stack_fffffffffffff498,
             in_stack_fffffffffffff490,(FabFactory<amrex::EBCellFlagFab> *)in_stack_fffffffffffff4c0
            );
  DefaultFabFactory<amrex::EBCellFlagFab>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::EBCellFlagFab> *)0x11f8dc6);
  MFInfo::~MFInfo((MFInfo *)0x11f8dd3);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x11f8de0);
  fillEBCellFlag(in_stack_fffffffffffff7b8,
                 (FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 in_stack_fffffffffffff7a8);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x11f8e0c);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x11f8e19);
  MFIter::MFIter(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                 (uchar)((ulong)in_stack_fffffffffffff490 >> 0x38));
  while (bVar2 = MFIter::isValid(&local_3d0), bVar2) {
    this_00 = FabArray<amrex::EBCellFlagFab>::operator[](in_stack_fffffffffffff470,(MFIter *)rhs_00)
    ;
    local_3d4 = EBCellFlagFab::getType(this_00);
    MFIter::validbox((MFIter *)in_stack_fffffffffffff480);
    local_3e0 = local_3fc;
    if (local_3d4 == covered) {
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff480,
                 (value_type *)in_stack_fffffffffffff478);
    }
    else if (local_3d4 != regular) {
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff480,
                 (value_type *)in_stack_fffffffffffff478);
    }
    MFIter::operator++(&local_3d0);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff470);
  AllGatherBoxes(&local_358,0);
  AllGatherBoxes(&local_370,0);
  bVar2 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::empty
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff480);
  if (!bVar2) {
    BoxList::BoxList(in_stack_fffffffffffff478,
                     (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff470);
    BoxArray::BoxArray(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    BoxArray::operator=((BoxArray *)in_stack_fffffffffffff470,rhs_00);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff470);
    BoxList::~BoxList((BoxList *)0x11f9046);
  }
  bVar2 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::empty
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff480);
  if (bVar2) {
    local_78 = "!cut_boxes.empty()";
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_Level.cpp"
    ;
    local_84 = 0x27;
    local_90 = "\"EB2::Level: how come there are no cut boxes?\"";
    Assert_host(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff694,
                in_stack_fffffffffffff688);
  }
  BoxList::BoxList(in_stack_fffffffffffff478,
                   (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff470);
  BoxArray::BoxArray(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
  BoxArray::operator=((BoxArray *)in_stack_fffffffffffff470,rhs_00);
  BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff470);
  BoxList::~BoxList((BoxList *)0x11f9135);
  ParallelDescriptor::NProcs();
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
  DistributionMapping::operator=
            ((DistributionMapping *)in_stack_fffffffffffff470,(DistributionMapping *)rhs_00);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x11f9184);
  IntVect::IntVect(&local_5c,1);
  local_68 = local_5c.vect[2];
  local_70[0] = local_5c.vect[0];
  local_70[1] = local_5c.vect[1];
  local_5a0 = local_5c.vect[2];
  local_5a8[0] = local_5c.vect[0];
  local_5a8[1] = local_5c.vect[1];
  local_590 = local_5c.vect[2];
  local_598[0] = local_5c.vect[0];
  local_598[1] = local_5c.vect[1];
  convert(in_stack_fffffffffffff488,(IntVect *)in_stack_fffffffffffff480);
  local_5c8 = 0;
  uStack_5c0 = 0;
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5b8 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f9281);
  local_5e0 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
  MultiFab::define((MultiFab *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                   (DistributionMapping *)in_stack_fffffffffffff4b0,
                   (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8,
                   (MFInfo *)in_stack_fffffffffffff4a0,
                   (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff4d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x11f92ec);
  MFInfo::~MFInfo((MFInfo *)0x11f92f9);
  BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff470);
  fillLevelSet(in_stack_fffffffffffff710,in_stack_fffffffffffff708,in_stack_fffffffffffff700);
  local_5e4 = 2;
  local_608 = 0;
  uStack_600 = 0;
  local_618 = 0;
  uStack_610 = 0;
  local_5f8 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f93a0);
  local_620 = 0;
  DefaultFabFactory<amrex::EBCellFlagFab>::DefaultFabFactory
            ((DefaultFabFactory<amrex::EBCellFlagFab> *)in_stack_fffffffffffff470);
  FabArray<amrex::EBCellFlagFab>::define
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
             (DistributionMapping *)in_stack_fffffffffffff4a0,
             (int)((ulong)in_stack_fffffffffffff498 >> 0x20),(int)in_stack_fffffffffffff498,
             in_stack_fffffffffffff490,(FabFactory<amrex::EBCellFlagFab> *)in_stack_fffffffffffff4c0
            );
  DefaultFabFactory<amrex::EBCellFlagFab>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::EBCellFlagFab> *)0x11f940e);
  MFInfo::~MFInfo((MFInfo *)0x11f941b);
  fillEBCellFlag(in_stack_fffffffffffff7b8,
                 (FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 in_stack_fffffffffffff7a8);
  local_638 = 0;
  uStack_630 = 0;
  local_648 = 0;
  uStack_640 = 0;
  local_628 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f94aa);
  local_650 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
  MultiFab::define((MultiFab *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                   (DistributionMapping *)in_stack_fffffffffffff4b0,
                   (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8,
                   (MFInfo *)in_stack_fffffffffffff4a0,
                   (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff4d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9518);
  MFInfo::~MFInfo((MFInfo *)0x11f9525);
  fillVolFrac(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_668 = 0;
  uStack_660 = 0;
  local_678 = 0;
  uStack_670 = 0;
  local_658 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f95b4);
  local_680 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
  MultiFab::define((MultiFab *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                   (DistributionMapping *)in_stack_fffffffffffff4b0,
                   (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8,
                   (MFInfo *)in_stack_fffffffffffff4a0,
                   (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff4d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9622);
  MFInfo::~MFInfo((MFInfo *)0x11f962f);
  fillCentroid(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  local_698 = 0;
  uStack_690 = 0;
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_688 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f96be);
  local_6b0 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
  MultiFab::define((MultiFab *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                   (DistributionMapping *)in_stack_fffffffffffff4b0,
                   (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8,
                   (MFInfo *)in_stack_fffffffffffff4a0,
                   (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff4d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x11f972c);
  MFInfo::~MFInfo((MFInfo *)0x11f9739);
  fillBndryArea(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6b8 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f97c8);
  local_6e0 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
  MultiFab::define((MultiFab *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                   (DistributionMapping *)in_stack_fffffffffffff4b0,
                   (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8,
                   (MFInfo *)in_stack_fffffffffffff4a0,
                   (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff4d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9836);
  MFInfo::~MFInfo((MFInfo *)0x11f9843);
  fillBndryCent(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_708 = 0;
  uStack_700 = 0;
  local_6e8 = 0;
  MFInfo::MFInfo((MFInfo *)0x11f98d2);
  local_710 = 0;
  puVar4 = &local_710;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
  MultiFab::define((MultiFab *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                   (DistributionMapping *)in_stack_fffffffffffff4b0,
                   (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8,
                   (MFInfo *)in_stack_fffffffffffff4a0,
                   (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff4d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9940);
  MFInfo::~MFInfo((MFInfo *)0x11f994d);
  fillBndryNorm(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  for (local_714 = 0; local_714 < 3; local_714 = local_714 + 1) {
    pvVar3 = std::array<amrex::MultiFab,_3UL>::operator[]
                       ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff470,(size_type)puVar4);
    local_1c = local_714;
    if (local_714 == 0) {
      IntVect::IntVect(&local_18,1,0,0);
    }
    else if (local_714 == 1) {
      IntVect::IntVect(&local_18,0,1,0);
    }
    else {
      IntVect::IntVect(&local_18,0,0,1);
    }
    local_28 = local_18.vect[2];
    local_30[0] = local_18.vect[0];
    local_30[1] = local_18.vect[1];
    local_798 = local_18.vect[2];
    local_7a0[0] = local_18.vect[0];
    local_7a0[1] = local_18.vect[1];
    local_788 = local_18.vect[2];
    local_790[0] = local_18.vect[0];
    local_790[1] = local_18.vect[1];
    convert(in_stack_fffffffffffff488,(IntVect *)in_stack_fffffffffffff480);
    local_7b8 = 0;
    uStack_7b0 = 0;
    local_7c8 = 0;
    uStack_7c0 = 0;
    local_7a8 = 0;
    MFInfo::MFInfo((MFInfo *)0x11f9af1);
    local_7d0 = 0;
    puVar4 = &local_7d0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
    (*(pvVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pvVar3,local_780,in_RDI[2].super_CoordSys.offset + 2,1,2,&local_7c8);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9b63);
    MFInfo::~MFInfo((MFInfo *)0x11f9b70);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff470);
    in_stack_fffffffffffff4e0 =
         (Level *)std::array<amrex::MultiFab,_3UL>::operator[]
                            ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff470,
                             (size_type)puVar4);
    local_40 = local_714;
    if (local_714 == 0) {
      IntVect::IntVect(&local_3c,1,0,0);
    }
    else if (local_714 == 1) {
      IntVect::IntVect(&local_3c,0,1,0);
    }
    else {
      IntVect::IntVect(&local_3c,0,0,1);
    }
    local_48 = local_3c.vect[2];
    local_50[0] = local_3c.vect[0];
    local_50[1] = local_3c.vect[1];
    convert(in_stack_fffffffffffff488,(IntVect *)in_stack_fffffffffffff480);
    in_stack_fffffffffffff4d0 = (Level *)(in_RDI[2].super_CoordSys.offset + 2);
    in_stack_fffffffffffff778 = (Level *)0x0;
    in_stack_fffffffffffff780 = (Level *)0x0;
    in_stack_fffffffffffff4d8 = (Array<MultiFab_*,_3> *)&stack0xfffffffffffff778;
    MFInfo::MFInfo((MFInfo *)0x11f9cde);
    in_stack_fffffffffffff770 = (Geometry *)0x0;
    __n = &stack0xfffffffffffff770;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
    (*(((FabArray<amrex::FArrayBox> *)&in_stack_fffffffffffff4e0->m_geom)->super_FabArrayBase).
      _vptr_FabArrayBase[2])
              (in_stack_fffffffffffff4e0,local_838,in_stack_fffffffffffff4d0,2,2,
               in_stack_fffffffffffff4d8);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9d3f);
    MFInfo::~MFInfo((MFInfo *)0x11f9d4c);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff470);
    this_01 = (IntVect *)&stack0xfffffffffffff764;
    IntVect::IntVect(this_01,1);
    local_c = local_714;
    this_01->vect[local_714] = 0;
    local_8 = this_01;
    pvVar3 = std::array<amrex::MultiFab,_3UL>::operator[]
                       ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff470,(size_type)__n);
    convert(in_stack_fffffffffffff488,(IntVect *)in_stack_fffffffffffff480);
    pRVar5 = in_RDI[2].super_CoordSys.offset + 2;
    local_928 = 0;
    local_938 = 0;
    uStack_930 = 0;
    puVar6 = &local_938;
    MFInfo::MFInfo((MFInfo *)0x11f9e2a);
    local_940 = 0;
    puVar4 = &local_940;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff470);
    (*(pvVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pvVar3,local_908,pRVar5,1,2,puVar6);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x11f9e8d);
    MFInfo::~MFInfo((MFInfo *)0x11f9e9a);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff470);
  }
  GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff470);
  fillAreaFrac(in_stack_fffffffffffff778,(Array<MultiFab_*,_3> *)in_stack_fffffffffffff770,
               in_stack_fffffffffffff768);
  GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff470);
  fillFaceCent(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
               &in_stack_fffffffffffff4d0->m_geom);
  GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((array<amrex::MultiFab,_3UL> *)local_d0);
  fillEdgeCent(in_stack_fffffffffffff780,(Array<MultiFab_*,_3> *)in_stack_fffffffffffff778,
               in_stack_fffffffffffff770);
  *(undefined1 *)((long)in_RDI[0x22].super_CoordSys.inv_dx + 1) = 1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x11fa1e0);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x11fa1ed);
  FabArray<amrex::EBCellFlagFab>::~FabArray(local_d0);
  BoxArray::~BoxArray((BoxArray *)local_d0);
  return;
}

Assistant:

void
Level::prepareForCoarsening (const Level& rhs, int max_grid_size, IntVect ngrow)
{
    BoxArray all_grids(amrex::grow(m_geom.Domain(),ngrow));
    all_grids.maxSize(max_grid_size);
    FabArray<EBCellFlagFab> cflag(all_grids, DistributionMapping{all_grids}, 1, 1);
    rhs.fillEBCellFlag(cflag, m_geom);

    Vector<Box> cut_boxes;
    Vector<Box> covered_boxes;

    for (MFIter mfi(cflag); mfi.isValid(); ++mfi)
    {
        FabType t = cflag[mfi].getType();
        AMREX_ASSERT(t != FabType::undefined);
        const Box& vbx = mfi.validbox();
        if (t == FabType::covered) {
            covered_boxes.push_back(vbx);
        } else if (t != FabType::regular) {
            cut_boxes.push_back(vbx);
        }
    }

    amrex::AllGatherBoxes(cut_boxes);
    amrex::AllGatherBoxes(covered_boxes);

    if (!covered_boxes.empty()) {
        m_covered_grids = BoxArray(BoxList(std::move(covered_boxes)));
    }

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!cut_boxes.empty(),
                                     "EB2::Level: how come there are no cut boxes?");

    m_grids = BoxArray(BoxList(std::move(cut_boxes)));
    m_dmap = DistributionMapping(m_grids);

    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    rhs.fillLevelSet(m_levelset, m_geom);

//    m_mgf.define(m_grids, m_dmap);
    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    rhs.fillEBCellFlag(m_cellflag, m_geom);

    m_volfrac.define(m_grids, m_dmap, 1, ng);
    rhs.fillVolFrac(m_volfrac, m_geom);

    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillCentroid(m_centroid, m_geom);

    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    rhs.fillBndryArea(m_bndryarea, m_geom);

    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillBndryCent(m_bndrycent, m_geom);

    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillBndryNorm(m_bndrynorm, m_geom);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }
    rhs.fillAreaFrac(amrex::GetArrOfPtrs(m_areafrac), m_geom);
    rhs.fillFaceCent(amrex::GetArrOfPtrs(m_facecent), m_geom);
    rhs.fillEdgeCent(amrex::GetArrOfPtrs(m_edgecent), m_geom);

    m_ok = true;
}